

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O3

void Gia_ManPrintEquivs(Gia_Man_t *p)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  
  printf("Const0:");
  iVar1 = p->nObjs;
  if (0 < iVar1) {
    lVar3 = 0;
    uVar4 = 0;
    do {
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      uVar2 = *(uint *)(&p->pObjs->field_0x0 + lVar3);
      if (((~uVar2 & 0x1fffffff) != 0 && -1 < (int)uVar2) &&
         (((uint)p->pReprs[uVar4] & 0xfffffff) == 0)) {
        printf(" %d",uVar4 & 0xffffffff);
        iVar1 = p->nObjs;
      }
      uVar4 = uVar4 + 1;
      lVar3 = lVar3 + 0xc;
    } while ((long)uVar4 < (long)iVar1);
  }
  putchar(10);
  iVar1 = p->nObjs;
  if (1 < iVar1) {
    uVar4 = 1;
    do {
      if (((~(uint)p->pReprs[uVar4] & 0xfffffff) == 0) && (0 < p->pNexts[uVar4])) {
        printf("%d:",uVar4 & 0xffffffff);
        if (((~(uint)p->pReprs[uVar4] & 0xfffffff) != 0) ||
           (uVar2 = p->pNexts[uVar4], (int)uVar2 < 1)) {
          __assert_fail("Gia_ObjIsHead(p, i)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                        ,0x12ba,"void Gia_ManPrintEquivs(Gia_Man_t *)");
        }
        do {
          printf(" %d",(ulong)uVar2);
          uVar2 = p->pNexts[uVar2];
        } while (0 < (int)uVar2);
        putchar(10);
        iVar1 = p->nObjs;
      }
      uVar4 = uVar4 + 1;
    } while ((long)uVar4 < (long)iVar1);
  }
  return;
}

Assistant:

void Gia_ManPrintEquivs( Gia_Man_t * p )
{
    Gia_Obj_t * pObj; int i, iObj;
    printf( "Const0:" );
    Gia_ManForEachAnd( p, pObj, i )
        if ( Gia_ObjRepr(p, i) == 0 )
            printf( " %d", i );
    printf( "\n" );
    Gia_ManForEachClass( p, i )
    {
        printf( "%d:", i );
        Gia_ClassForEachObj1( p, i, iObj )
            printf( " %d", iObj );
        printf( "\n" );
    }
}